

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall embree::TutorialApplication::set_scene(TutorialApplication *this,TutorialScene *in)

{
  ISPCScene *this_00;
  
  this_00 = (ISPCScene *)ISPCScene::operator_new(0x38);
  ISPCScene::ISPCScene(this_00,g_device,in);
  std::__uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>::reset
            ((__uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_> *)
             &this->ispc_scene,this_00);
  g_ispc_scene = (this->ispc_scene)._M_t.
                 super___uniq_ptr_impl<embree::ISPCScene,_std::default_delete<embree::ISPCScene>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_embree::ISPCScene_*,_std::default_delete<embree::ISPCScene>_>
                 .super__Head_base<0UL,_embree::ISPCScene_*,_false>._M_head_impl;
  return;
}

Assistant:

void TutorialApplication::set_scene (TutorialScene* in)
  {
    ispc_scene.reset(new ISPCScene(g_device,in));
    g_ispc_scene = ispc_scene.get();
  }